

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c++
# Opt level: O0

MainBuilder * __thiscall
kj::MainBuilder::addSubCommand
          (MainBuilder *this,StringPtr name,
          Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>
          *getSubParser,StringPtr helpText)

{
  bool bVar1;
  Impl *pIVar2;
  size_t sVar3;
  Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()> *pFVar4;
  __enable_if_t<is_constructible<value_type,_pair<StringPtr,_SubCommand>_>::value,_pair<iterator,_bool>_>
  _Var5;
  Fault local_d0;
  Fault f_2;
  SubCommand local_b8;
  pair<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand> local_98;
  _Base_ptr local_68;
  undefined1 local_60;
  Fault local_58;
  Fault f_1;
  Fault local_40;
  Fault f;
  Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>
  *getSubParser_local;
  MainBuilder *this_local;
  StringPtr helpText_local;
  StringPtr name_local;
  
  helpText_local.content.ptr = (char *)helpText.content.size_;
  helpText_local.content.size_ = (size_t)name.content.ptr;
  f.exception = (Exception *)getSubParser;
  pIVar2 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
  sVar3 = Vector<kj::MainBuilder::Impl::Arg>::size(&pIVar2->args);
  if (sVar3 != 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[50]>
              (&local_40,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
               ,0x16c,FAILED,"impl->args.size() == 0",
               "\"cannot have sub-commands when expecting arguments\"",
               (char (*) [50])"cannot have sub-commands when expecting arguments");
    kj::_::Debug::Fault::fatal(&local_40);
  }
  pIVar2 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
  bVar1 = Maybe<kj::Function<kj::MainBuilder::Validity_()>_>::operator==
                    (&pIVar2->finalCallback,(void *)0x0);
  if (!bVar1) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[57]>
              (&local_58,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
               ,0x16e,FAILED,"impl->finalCallback == nullptr",
               "\"cannot have a final callback when accepting sub-commands\"",
               (char (*) [57])"cannot have a final callback when accepting sub-commands");
    kj::_::Debug::Fault::fatal(&local_58);
  }
  pIVar2 = Own<kj::MainBuilder::Impl>::operator->(&this->impl);
  pFVar4 = mv<kj::Function<kj::Function<void(kj::StringPtr,kj::ArrayPtr<kj::StringPtr_const>)>()>>
                     (getSubParser);
  Function<kj::Function<void_(kj::StringPtr,_kj::ArrayPtr<const_kj::StringPtr>)>_()>::Function
            (&local_b8.func,pFVar4);
  local_b8.helpText.content.size_ = (size_t)helpText_local.content.ptr;
  local_b8.helpText.content.ptr = helpText.content.ptr;
  std::make_pair<kj::StringPtr&,kj::MainBuilder::Impl::SubCommand>
            (&local_98,(StringPtr *)&helpText_local.content.size_,&local_b8);
  _Var5 = std::
          map<kj::StringPtr,kj::MainBuilder::Impl::SubCommand,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::MainBuilder::Impl::SubCommand>>>
          ::insert<std::pair<kj::StringPtr,kj::MainBuilder::Impl::SubCommand>>
                    ((map<kj::StringPtr,kj::MainBuilder::Impl::SubCommand,std::less<kj::StringPtr>,std::allocator<std::pair<kj::StringPtr_const,kj::MainBuilder::Impl::SubCommand>>>
                      *)&pIVar2->subCommands,&local_98);
  f_2.exception = (Exception *)_Var5.first._M_node;
  local_60 = _Var5.second;
  local_68 = (_Base_ptr)f_2.exception;
  std::pair<kj::StringPtr,_kj::MainBuilder::Impl::SubCommand>::~pair(&local_98);
  Impl::SubCommand::~SubCommand(&local_b8);
  if (((undefined1  [16])_Var5 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22],kj::StringPtr&>
              (&local_d0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/main.c++"
               ,0x172,FAILED,
               "impl->subCommands.insert(std::make_pair( name, Impl::SubCommand { kj::mv(getSubParser), helpText })).second"
               ,"\"duplicate sub-command\", name",(char (*) [22])"duplicate sub-command",
               (StringPtr *)&helpText_local.content.size_);
    kj::_::Debug::Fault::fatal(&local_d0);
  }
  return this;
}

Assistant:

MainBuilder& MainBuilder::addSubCommand(StringPtr name, Function<MainFunc()> getSubParser,
                                        StringPtr helpText) {
  KJ_REQUIRE(impl->args.size() == 0, "cannot have sub-commands when expecting arguments");
  KJ_REQUIRE(impl->finalCallback == nullptr,
             "cannot have a final callback when accepting sub-commands");
  KJ_REQUIRE(
      impl->subCommands.insert(std::make_pair(
          name, Impl::SubCommand { kj::mv(getSubParser), helpText })).second,
      "duplicate sub-command", name);
  return *this;
}